

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Table_IterationOrderChangesByInstance_Test::TestBody
          (Table_IterationOrderChangesByInstance_Test *this)

{
  int iVar1;
  ctrl_t *pcVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  vector<int,_std::allocator<int>_> reference;
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  tables;
  IntTable reference_table;
  AssertHelper AStack_e8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  local_c8;
  long local_b0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  local_a8;
  int local_78 [6];
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  local_60;
  
  local_78[0] = 2;
  local_78[1] = 6;
  local_78[2] = 0xc;
  local_78[3] = 0x14;
  local_b0 = 0;
  while( true ) {
    iVar1 = *(int *)((long)local_78 + local_b0);
    MakeSimpleTable((IntTable *)&local_60,(long)iVar1);
    OrderOfIteration(&local_e0,(IntTable *)&local_60);
    local_c8.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = 0;
    do {
      MakeSimpleTable((IntTable *)&local_a8,(long)iVar1);
      std::
      vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
      ::push_back(&local_c8,(value_type *)&local_a8);
      raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ::destroy_slots(&local_a8);
      OrderOfIteration((vector<int,_std::allocator<int>_> *)&local_a8,
                       local_c8.
                       super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
      pcVar2 = local_a8.ctrl_;
      bVar6 = true;
      if ((long)local_a8.slots_ - (long)local_a8.ctrl_ ==
          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
        if (local_a8.slots_ == (slot_type *)local_a8.ctrl_) {
          bVar6 = false;
        }
        else {
          iVar3 = bcmp(local_a8.ctrl_,
                       local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(long)local_a8.slots_ - (long)local_a8.ctrl_
                      );
          bVar6 = iVar3 != 0;
        }
      }
      if ((long *)pcVar2 != (long *)0x0) {
        operator_delete(pcVar2,local_a8.size_ - (long)pcVar2);
      }
      bVar5 = 0x1386 < uVar4;
      uVar4 = uVar4 + 1;
    } while (!(bool)(bVar5 | bVar6));
    if (!bVar6) break;
    std::
    vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ::~vector(&local_c8);
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::destroy_slots(&local_60);
    local_b0 = local_b0 + 4;
    if (local_b0 == 0x10) {
      return;
    }
  }
  testing::Message::Message((Message *)&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)((long)local_a8.ctrl_ + 0x10),
             "Iteration order remained the same across many attempts with size ",0x41);
  std::ostream::_M_insert<unsigned_long>((ulong)((long)local_a8.ctrl_ + 0x10));
  testing::internal::AssertHelper::AssertHelper
            (&AStack_e8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
             ,0x709,"Failed");
  testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_a8);
  testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
  if ((long *)local_a8.ctrl_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8.ctrl_ + 8))();
  }
  std::
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ::~vector(&local_c8);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  ::destroy_slots(&local_60);
  return;
}

Assistant:

TEST(Table, IterationOrderChangesByInstance) {
  for (size_t size : {2, 6, 12, 20}) {
    const auto reference_table = MakeSimpleTable(size);
    const auto reference = OrderOfIteration(reference_table);

    std::vector<IntTable> tables;
    bool found_difference = false;
    for (int i = 0; !found_difference && i < 5000; ++i) {
      tables.push_back(MakeSimpleTable(size));
      found_difference = OrderOfIteration(tables.back()) != reference;
    }
    if (!found_difference) {
      FAIL()
          << "Iteration order remained the same across many attempts with size "
          << size;
    }
  }
}